

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::UniformType::fill(UniformType *this)

{
  GLenum GVar1;
  pair<int,_int> pVar2;
  
  this->size = (pair<int,_int>)&DAT_100000001;
  GVar1 = this->enumType;
  switch(GVar1) {
  case 0x8b50:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1406;
    goto LAB_00bdad88;
  case 0x8b51:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1406;
    goto LAB_00bdade2;
  case 0x8b52:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1406;
    goto LAB_00bdae46;
  case 0x8b53:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1404;
LAB_00bdad88:
    (this->size).first = 2;
    return;
  case 0x8b54:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1404;
LAB_00bdade2:
    (this->size).first = 3;
    return;
  case 0x8b55:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::_M_assign((string *)&this->refStrType);
    this->baseType = 0x1404;
LAB_00bdae46:
    (this->size).first = 4;
    return;
  case 0x8b5a:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 2;
    pVar2.second = 2;
    break;
  case 0x8b5b:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 3;
    pVar2.second = 3;
    break;
  case 0x8b5c:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 4;
    pVar2.second = 4;
    break;
  case 0x8b5e:
    std::__cxx11::string::assign((char *)&this->refStrType);
    std::__cxx11::string::assign((char *)&this->strType);
    this->baseType = 0x82e6;
    return;
  case 0x8b65:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 3;
    pVar2.second = 2;
    break;
  case 0x8b66:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 4;
    pVar2.second = 2;
    break;
  case 0x8b67:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 2;
    pVar2.second = 3;
    break;
  case 0x8b68:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 4;
    pVar2.second = 3;
    break;
  case 0x8b69:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 2;
    pVar2.second = 4;
    break;
  case 0x8b6a:
    std::__cxx11::string::assign((char *)&this->strType);
    std::__cxx11::string::assign((char *)&this->refStrType);
    this->baseType = 0x1406;
    pVar2.first = 3;
    pVar2.second = 4;
    break;
  default:
    if (GVar1 == 0x1404) {
      std::__cxx11::string::assign((char *)&this->strType);
      std::__cxx11::string::_M_assign((string *)&this->refStrType);
      this->baseType = 0x1404;
      return;
    }
    if (GVar1 == 0x1405) {
      std::__cxx11::string::assign((char *)&this->strType);
      std::__cxx11::string::_M_assign((string *)&this->refStrType);
      this->baseType = 0x1405;
      this->signedType = false;
      return;
    }
    if (GVar1 == 0x1406) {
      std::__cxx11::string::assign((char *)&this->strType);
      std::__cxx11::string::_M_assign((string *)&this->refStrType);
      this->baseType = 0x1406;
      return;
    }
  case 0x8b56:
  case 0x8b57:
  case 0x8b58:
  case 0x8b59:
  case 0x8b5d:
  case 0x8b5f:
  case 0x8b60:
  case 0x8b61:
  case 0x8b62:
  case 0x8b63:
  case 0x8b64:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                  ,0x1f6,"void glcts::(anonymous namespace)::UniformType::fill()");
  }
  this->size = pVar2;
  return;
}

Assistant:

void fill()
	{

		size = std::pair<int, int>(1, 1);

		switch (enumType)
		{
		case GL_SAMPLER_2D:
			refStrType = "vec4";
			strType	= "sampler2D";
			baseType   = GL_SAMPLER;
			break;
		case GL_FLOAT:
			refStrType = strType = "float";
			baseType			 = GL_FLOAT;
			break;
		case GL_INT:
			refStrType = strType = "int";
			baseType			 = GL_INT;
			break;
		case GL_UNSIGNED_INT:
			refStrType = strType = "uint";
			baseType			 = GL_UNSIGNED_INT;
			signedType			 = false;
			break;
		case GL_FLOAT_VEC2:
			refStrType = strType = "vec2";
			baseType			 = GL_FLOAT;
			size.first			 = 2;
			break;
		case GL_FLOAT_VEC3:
			refStrType = strType = "vec3";
			baseType			 = GL_FLOAT;
			size.first			 = 3;
			break;
		case GL_FLOAT_VEC4:
			refStrType = strType = "vec4";
			baseType			 = GL_FLOAT;
			size.first			 = 4;
			break;
		case GL_FLOAT_MAT2:
			strType	= "mat2";
			refStrType = "vec2";
			baseType   = GL_FLOAT;
			size.first = size.second = 2;
			break;
		case GL_FLOAT_MAT3:
			strType	= "mat3";
			refStrType = "vec3";
			baseType   = GL_FLOAT;
			size.first = size.second = 3;
			break;
		case GL_FLOAT_MAT4:
			strType	= "mat4";
			refStrType = "vec4";
			baseType   = GL_FLOAT;
			size.first = size.second = 4;
			break;
		case GL_FLOAT_MAT2x3:
			strType		= "mat2x3";
			refStrType  = "vec3";
			baseType	= GL_FLOAT;
			size.first  = 3;
			size.second = 2;
			break;
		case GL_FLOAT_MAT4x3:
			strType		= "mat4x3";
			refStrType  = "vec3";
			baseType	= GL_FLOAT;
			size.first  = 3;
			size.second = 4;
			break;
		case GL_FLOAT_MAT2x4:
			strType		= "mat2x4";
			refStrType  = "vec4";
			baseType	= GL_FLOAT;
			size.first  = 4;
			size.second = 2;
			break;
		case GL_FLOAT_MAT3x4:
			strType		= "mat3x4";
			refStrType  = "vec4";
			baseType	= GL_FLOAT;
			size.first  = 4;
			size.second = 3;
			break;
		case GL_FLOAT_MAT3x2:
			strType		= "mat3x2";
			refStrType  = "vec2";
			baseType	= GL_FLOAT;
			size.first  = 2;
			size.second = 3;
			break;
		case GL_FLOAT_MAT4x2:
			strType		= "mat4x2";
			refStrType  = "vec2";
			baseType	= GL_FLOAT;
			size.first  = 2;
			size.second = 4;
			break;
		case GL_INT_VEC2:
			refStrType = strType = "ivec2";
			baseType			 = GL_INT;
			size.first			 = 2;
			break;
		case GL_INT_VEC3:
			refStrType = strType = "ivec3";
			baseType			 = GL_INT;
			size.first			 = 3;
			break;
		case GL_INT_VEC4:
			refStrType = strType = "ivec4";
			baseType			 = GL_INT;
			size.first			 = 4;
			break;
		default:
			assert(0);
		}
	}